

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcCircleHollowProfileDef::~IfcCircleHollowProfileDef
          (IfcCircleHollowProfileDef *this,void **vtt)

{
  void **vtt_local;
  IfcCircleHollowProfileDef *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcCircleHollowProfileDef,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcCircleHollowProfileDef,_1UL> *)
             &(this->super_IfcCircleProfileDef).field_0x88,vtt + 0x10);
  IfcCircleProfileDef::~IfcCircleProfileDef(&this->super_IfcCircleProfileDef,vtt + 1);
  return;
}

Assistant:

IfcCircleHollowProfileDef() : Object("IfcCircleHollowProfileDef") {}